

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O0

PageDesc * page_find_alloc(uc_struct_conflict15 *uc,tb_page_addr_t index,int alloc)

{
  void *pvVar1;
  void **ppvVar2;
  void *existing_1;
  void *existing;
  void **p;
  void **ppvStack_38;
  int i;
  void **lp;
  PageDesc *pd;
  int alloc_local;
  tb_page_addr_t index_local;
  uc_struct_conflict15 *uc_local;
  
  ppvStack_38 = uc->l1_map + (index >> ((byte)uc->v_l1_shift & 0x3f) & (long)(uc->v_l1_size + -1));
  for (p._4_4_ = uc->v_l2_levels; 0 < p._4_4_; p._4_4_ = p._4_4_ + -1) {
    existing = *ppvStack_38;
    if (*ppvStack_38 == (void *)0x0) {
      if (alloc == 0) {
        return (PageDesc *)0x0;
      }
      existing = g_malloc0_n(0x400,8);
      pvVar1 = *ppvStack_38;
      if (*ppvStack_38 == (void *)0x0) {
        *ppvStack_38 = existing;
      }
      if (pvVar1 != (void *)0x0) {
        g_free(existing);
        existing = pvVar1;
      }
    }
    ppvStack_38 = (void **)((long)existing + (index >> ((char)p._4_4_ * '\n' & 0x3fU) & 0x3ff) * 8);
  }
  lp = (void **)*ppvStack_38;
  if ((void **)*ppvStack_38 == (void **)0x0) {
    if (alloc == 0) {
      return (PageDesc *)0x0;
    }
    lp = (void **)g_malloc0_n(0x400,0x18);
    ppvVar2 = (void **)*ppvStack_38;
    if (*ppvStack_38 == (void *)0x0) {
      *ppvStack_38 = lp;
    }
    if (ppvVar2 != (void **)0x0) {
      g_free(lp);
      lp = ppvVar2;
    }
  }
  return (PageDesc *)(lp + (index & 0x3ff) * 3);
}

Assistant:

static PageDesc *page_find_alloc(struct uc_struct *uc, tb_page_addr_t index, int alloc)
{
    PageDesc *pd;
    void **lp;
    int i;

    /* Level 1.  Always allocated.  */
    lp = uc->l1_map + ((index >> uc->v_l1_shift) & (uc->v_l1_size - 1));

    /* Level 2..N-1.  */
    for (i = uc->v_l2_levels; i > 0; i--) {
        void **p = *lp;

        if (p == NULL) {
            void *existing;

            if (!alloc) {
                return NULL;
            }
            p = g_new0(void *, V_L2_SIZE);
            existing = *lp;
            if (*lp == NULL) {
                *lp = p;
            }
            if (unlikely(existing)) {
                g_free(p);
                p = existing;
            }
        }

        lp = p + ((index >> (i * V_L2_BITS)) & (V_L2_SIZE - 1));
    }

    pd = *lp;
    if (pd == NULL) {
        void *existing;

        if (!alloc) {
            return NULL;
        }
        pd = g_new0(PageDesc, V_L2_SIZE);
        existing = *lp;
        if (*lp == NULL) {
            *lp = pd;
        }
        if (unlikely(existing)) {
            g_free(pd);
            pd = existing;
        }
    }

    return pd + (index & (V_L2_SIZE - 1));
}